

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

void duckdb::QuantileOperation::
     Operation<signed_char,duckdb::QuantileState<signed_char,duckdb::QuantileStandardType>,duckdb::QuantileListOperation<signed_char,true>>
               (QuantileState<signed_char,_duckdb::QuantileStandardType> *state,char *input,
               AggregateUnaryInput *aggr_input)

{
  QuantileState<signed_char,_duckdb::QuantileStandardType>::AddElement
            (state,*input,aggr_input->input);
  return;
}

Assistant:

static void Operation(STATE &state, const INPUT_TYPE &input, AggregateUnaryInput &aggr_input) {
		state.AddElement(input, aggr_input.input);
	}